

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_copy_and_apply_volume_and_clip_samples_s16
               (ma_int16 *pDst,ma_int32 *pSrc,ma_uint64 count,float volume)

{
  int local_48;
  ma_int16 local_44;
  int local_40;
  ma_int16 volumeFixed;
  ma_uint64 iSample;
  float volume_local;
  ma_uint64 count_local;
  ma_int32 *pSrc_local;
  ma_int16 *pDst_local;
  
  for (iSample = 0; iSample < count; iSample = iSample + 1) {
    local_48 = pSrc[iSample] * (int)(short)(int)(volume * 256.0) >> 8;
    local_40 = local_48;
    if (0x7ffe < local_48) {
      local_40 = 0x7fff;
    }
    if (local_40 < -0x8000) {
      local_44 = -0x8000;
    }
    else {
      if (0x7ffe < local_48) {
        local_48 = 0x7fff;
      }
      local_44 = (ma_int16)local_48;
    }
    pDst[iSample] = local_44;
  }
  return;
}

Assistant:

MA_API void ma_copy_and_apply_volume_and_clip_samples_s16(ma_int16* pDst, const ma_int32* pSrc, ma_uint64 count, float volume)
{
    ma_uint64 iSample;
    ma_int16  volumeFixed;

    MA_ASSERT(pDst != NULL);
    MA_ASSERT(pSrc != NULL);

    volumeFixed = ma_float_to_fixed_16(volume);

    for (iSample = 0; iSample < count; iSample += 1) {
        pDst[iSample] = ma_clip_s16(ma_apply_volume_unclipped_s16(pSrc[iSample], volumeFixed));
    }
}